

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
          (SourceLocationCommentPrinter *this,string *output)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  string local_118;
  AlphaNum local_f8;
  AlphaNum local_c8;
  string local_88;
  AlphaNum local_68;
  reference local_38;
  string *leading_detached_comment;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string *output_local;
  SourceLocationCommentPrinter *this_local;
  
  if ((this->have_source_loc_ & 1U) != 0) {
    this_00 = &(this->source_loc_).leading_detached_comments;
    __end4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    leading_detached_comment =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&leading_detached_comment), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end4);
      FormatComment(&local_88,this,local_38);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_68,&local_88);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,"\n");
      absl::lts_20250127::StrAppend(output,&local_68,&local_c8);
      std::__cxx11::string::~string((string *)&local_88);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end4);
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      FormatComment(&local_118,this,&(this->source_loc_).leading_comments);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_f8,&local_118);
      absl::lts_20250127::StrAppend(output,&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  return;
}

Assistant:

void AddPreComment(std::string* output) {
    if (have_source_loc_) {
      // Detached leading comments.
      for (const std::string& leading_detached_comment :
           source_loc_.leading_detached_comments) {
        absl::StrAppend(output, FormatComment(leading_detached_comment), "\n");
      }
      // Attached leading comments.
      if (!source_loc_.leading_comments.empty()) {
        absl::StrAppend(output, FormatComment(source_loc_.leading_comments));
      }
    }
  }